

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O0

int load_key_RSA(SSL_CTX *ssl_ctx,EVP_PKEY *evp_key)

{
  int iVar1;
  rsa_st *rsa;
  RSA *privatekey;
  int result;
  EVP_PKEY *evp_key_local;
  SSL_CTX *ssl_ctx_local;
  
  rsa = EVP_PKEY_get1_RSA((EVP_PKEY *)evp_key);
  if (rsa == (rsa_st *)0x0) {
    log_ERR_get_error("Failure reading RSA private key");
    privatekey._4_4_ = 0x93;
  }
  else {
    iVar1 = SSL_CTX_use_RSAPrivateKey((SSL_CTX *)ssl_ctx,rsa);
    if (iVar1 == 1) {
      privatekey._4_4_ = 0;
    }
    else {
      log_ERR_get_error("Failure calling SSL_CTX_use_RSAPrivateKey");
      privatekey._4_4_ = 0x9c;
    }
    RSA_free(rsa);
  }
  return privatekey._4_4_;
}

Assistant:

static int load_key_RSA(SSL_CTX* ssl_ctx, EVP_PKEY* evp_key)
{
    int result;
    /*Codes_SRS_X509_OPENSSL_02_005: [ x509_openssl_add_credentials shall use PEM_read_bio_RSAPrivateKey to read the x509 private key. ]*/
    RSA* privatekey = EVP_PKEY_get1_RSA(evp_key);
    if (privatekey == NULL)
    {
        /*Codes_SRS_X509_OPENSSL_02_009: [ Otherwise x509_openssl_add_credentials shall fail and return a non-zero number. ]*/
        log_ERR_get_error("Failure reading RSA private key");
        result = MU_FAILURE;
    }
    else
    {
        /*Codes_SRS_X509_OPENSSL_02_007: [ x509_openssl_add_credentials shall use SSL_CTX_use_RSAPrivateKey to load the private key into the SSL context. ]*/
        if (SSL_CTX_use_RSAPrivateKey(ssl_ctx, privatekey) != 1)
        {
            /*Codes_SRS_X509_OPENSSL_02_009: [ Otherwise x509_openssl_add_credentials shall fail and return a non-zero number. ]*/
            log_ERR_get_error("Failure calling SSL_CTX_use_RSAPrivateKey");
            result = MU_FAILURE;
        }
        else
        {
            /*all is fine*/
            /*Codes_SRS_X509_OPENSSL_02_008: [ If no error occurs, then x509_openssl_add_credentials shall succeed and return 0. ]*/
            result = 0;
        }
        RSA_free(privatekey);
    }
    return result;
}